

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_exception(XmlReporter *this,TestCaseException *e)

{
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::mutex::lock(&this->mutex);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"Exception",&local_81);
  XmlWriter::scopedElement((XmlWriter *)local_80,(string *)&this->xml);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"crash",&local_82);
  XmlWriter::ScopedElement::writeAttribute<bool>((ScopedElement *)local_80,&local_58,&e->is_crash);
  if ((e->error_string).field_0.buf[0x17] < '\0') {
    e = (TestCaseException *)(e->error_string).field_0.data.ptr;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_80 + 8),(char *)e,&local_83);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_80,(string *)(local_80 + 8),true);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
  std::__cxx11::string::~string(local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);

            xml.scopedElement("Exception")
                    .writeAttribute("crash", e.is_crash)
                    .writeText(e.error_string.c_str());
        }